

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shift.c
# Opt level: O2

LispPTR N_OP_llsh8(LispPTR a)

{
  LispPTR *pLVar1;
  uint *NAddr;
  uint uVar2;
  LispPTR LVar3;
  
  if ((a & 0xfff0000) == 0xf0000) {
    LVar3 = a | 0xffff0000;
  }
  else if ((a & 0xfff0000) == 0xe0000) {
    LVar3 = a & 0xffff;
  }
  else {
    if ((*(ushort *)((ulong)(a >> 8 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2) {
      MachineState.tosvalue = a;
      MachineState.errorexit = 1;
      return 0xffffffff;
    }
    pLVar1 = NativeAligned4FromLAddr(a);
    LVar3 = *pLVar1;
  }
  uVar2 = LVar3 << 8;
  if ((uVar2 & 0xffff0000) == 0xffff0000) {
    LVar3 = uVar2 & 0xff00 | 0xf0000;
  }
  else {
    if ((uVar2 & 0xffff0000) != 0) {
      NAddr = (uint *)createcell68k(2);
      *NAddr = uVar2;
      LVar3 = LAddrFromNative(NAddr);
      return LVar3;
    }
    LVar3 = uVar2 | 0xe0000;
  }
  return LVar3;
}

Assistant:

LispPTR N_OP_llsh8(LispPTR a) {
  int arg1;

  N_GETNUMBER(a, arg1, du_ufn);
  arg1 <<= 8;
  N_ARITH_SWITCH(arg1);

 du_ufn:
  ERROR_EXIT(a);
}